

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_function_prototype
          (CompilerGLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  uint uVar1;
  int iVar2;
  SPIRType *type;
  SPIRVariable *pSVar3;
  long lVar4;
  Parameter *arg;
  Parameter *pPVar5;
  string decl;
  string local_168;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arglist;
  
  if ((func->super_IVariant).self.id != (this->super_Compiler).ir.default_entry_point.id) {
    add_function_overload(this,func);
  }
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->local_variable_names,&(this->resource_names)._M_h);
  decl._M_dataplus._M_p = (pointer)&decl.field_2;
  decl._M_string_length = 0;
  decl.field_2._M_local_buf[0] = '\0';
  type = Compiler::get<spirv_cross::SPIRType>
                   (&this->super_Compiler,*(uint32_t *)&(func->super_IVariant).field_0xc);
  flags_to_qualifiers_glsl_abi_cxx11_((string *)&arglist,this,type,return_flags);
  ::std::__cxx11::string::append((string *)&decl);
  ::std::__cxx11::string::~string((string *)&arglist);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(&arglist,this,type,0);
  ::std::__cxx11::string::append((string *)&decl);
  ::std::__cxx11::string::~string((string *)&arglist);
  (*(this->super_Compiler)._vptr_Compiler[0x25])(&arglist,this,type);
  ::std::__cxx11::string::append((string *)&decl);
  ::std::__cxx11::string::~string((string *)&arglist);
  ::std::__cxx11::string::append((char *)&decl);
  uVar1 = (func->super_IVariant).self.id;
  if (uVar1 == (this->super_Compiler).ir.default_entry_point.id) {
    ::std::__cxx11::string::append((char *)&decl);
    this->processing_entry_point = true;
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[6])(&arglist,this,(ulong)uVar1,1);
    ::std::__cxx11::string::append((string *)&decl);
    ::std::__cxx11::string::~string((string *)&arglist);
  }
  ::std::__cxx11::string::append((char *)&decl);
  arglist.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arglist.stack_storage
  ;
  arglist.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  arglist.buffer_capacity = 8;
  pPVar5 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  for (lVar4 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
               * 0x14; lVar4 != 0; lVar4 = lVar4 + -0x14) {
    iVar2 = (*(this->super_Compiler)._vptr_Compiler[0x33])(this,(ulong)(pPVar5->id).id);
    if ((char)iVar2 == '\0') {
      add_local_variable_name(this,(pPVar5->id).id);
      argument_decl_abi_cxx11_(&local_168,this,pPVar5);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&arglist,&local_168);
      ::std::__cxx11::string::~string((string *)&local_168);
      pSVar3 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,(pPVar5->id).id)
      ;
      if (pSVar3 != (SPIRVariable *)0x0) {
        pSVar3->parameter = pPVar5;
      }
    }
    pPVar5 = pPVar5 + 1;
  }
  pPVar5 = (func->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  for (lVar4 = (func->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
               buffer_size * 0x14; lVar4 != 0; lVar4 = lVar4 + -0x14) {
    add_local_variable_name(this,(pPVar5->id).id);
    argument_decl_abi_cxx11_(&local_168,this,pPVar5);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&arglist,&local_168);
    ::std::__cxx11::string::~string((string *)&local_168);
    pSVar3 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,(pPVar5->id).id);
    if (pSVar3 != (SPIRVariable *)0x0) {
      pSVar3->parameter = pPVar5;
    }
    pPVar5 = pPVar5 + 1;
  }
  merge(&local_168,&arglist,", ");
  ::std::__cxx11::string::append((string *)&decl);
  ::std::__cxx11::string::~string((string *)&local_168);
  ::std::__cxx11::string::append((char *)&decl);
  statement<std::__cxx11::string&>(this,&decl);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&arglist);
  ::std::__cxx11::string::~string((string *)&decl);
  return;
}

Assistant:

void CompilerGLSL::emit_function_prototype(SPIRFunction &func, const Bitset &return_flags)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	// Avoid shadow declarations.
	local_variable_names = resource_names;

	string decl;

	auto &type = get<SPIRType>(func.return_type);
	decl += flags_to_qualifiers_glsl(type, return_flags);
	decl += type_to_glsl(type);
	decl += type_to_array_glsl(type);
	decl += " ";

	if (func.self == ir.default_entry_point)
	{
		// If we need complex fallback in GLSL, we just wrap main() in a function
		// and interlock the entire shader ...
		if (interlocked_is_complex)
			decl += "spvMainInterlockedBody";
		else
			decl += "main";

		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	SmallVector<string> arglist;
	for (auto &arg : func.arguments)
	{
		// Do not pass in separate images or samplers if we're remapping
		// to combined image samplers.
		if (skip_argument(arg.id))
			continue;

		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	for (auto &arg : func.shadow_arguments)
	{
		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += merge(arglist);
	decl += ")";
	statement(decl);
}